

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Columns(int columns_count,char *id,bool border)

{
  int *piVar1;
  undefined8 *puVar2;
  float fVar3;
  ImGuiID IVar4;
  ImGuiWindow *this;
  ImGuiStorage *this_00;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  ImU32 col;
  ImGuiColumnData *pIVar8;
  ImGuiContext *pIVar9;
  undefined7 in_register_00000011;
  byte bVar10;
  ImGuiContext *g;
  ImGuiColumnData *pIVar11;
  ImDrawList *this_01;
  int iVar12;
  char *str;
  ImGuiID IVar13;
  ImGuiContext *g_1;
  ulong uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  bool held;
  bool hovered;
  ImGuiID column_id;
  ImRect column_rect;
  bool local_92;
  bool local_91;
  char *local_90;
  float local_84;
  ImGuiWindow *local_80;
  float local_74;
  uint local_70;
  ImGuiID local_6c;
  ImVec4 local_68;
  float local_58;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar9 = GImGui;
  this = GImGui->CurrentWindow;
  this->Accessed = true;
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x2495,"void ImGui::Columns(int, const char *, bool)");
  }
  uVar14 = CONCAT71(in_register_00000011,border) & 0xffffffff;
  uVar7 = (uint)CONCAT71(in_register_00000011,border);
  local_90 = id;
  if ((this->DC).ColumnsCount != 1) {
    if ((this->DC).ColumnsCurrent != 0) {
      local_68.x = 0.0;
      local_68.y = 0.0;
      ItemSize((ImVec2 *)&local_68,0.0);
    }
    PopItemWidth();
    PopClipRect();
    ImDrawList::ChannelsMerge(this->DrawList);
    fVar16 = (this->DC).ColumnsCellMaxY;
    fVar17 = (this->DC).CursorPos.y;
    uVar15 = -(uint)(fVar17 <= fVar16);
    fVar16 = (float)(~uVar15 & (uint)fVar17 | (uint)fVar16 & uVar15);
    (this->DC).ColumnsCellMaxY = fVar16;
    (this->DC).CursorPos.y = fVar16;
    iVar12 = (this->DC).ColumnsCount;
    if ((((iVar12 != 1 && iVar12 != columns_count) && ((this->DC).ColumnsShowBorders == true)) &&
        (this->SkipItems == false)) && (1 < iVar12)) {
      local_80 = (ImGuiWindow *)CONCAT44(local_80._4_4_,(this->DC).CursorPos.y);
      local_84 = (this->DC).ColumnsStartPosY;
      local_74 = local_84 + 1.0;
      iVar12 = 1;
      local_70 = uVar7;
      do {
        local_58 = (this->Pos).x;
        fVar16 = GetColumnOffset(iVar12);
        local_58 = fVar16 + local_58;
        IVar13 = (this->DC).ColumnsSetId + iVar12;
        local_40.Min.x = local_58 + -4.0;
        local_40.Max.x = local_58 + 4.0;
        local_40.Min.y = local_84;
        local_40.Max.y = local_80._0_4_;
        local_6c = IVar13;
        bVar6 = IsClippedEx(&local_40,&local_6c,false);
        if (!bVar6) {
          bVar10 = 0;
          ButtonBehavior(&local_40,IVar13,&local_91,&local_92,0);
          if (((local_91 | local_92) & 1U) != 0) {
            bVar10 = local_91 ^ 1U | local_92;
            pIVar9->MouseCursor = 4;
          }
          uVar7 = local_91 | 0x1c;
          if ((bVar10 & 1) != 0) {
            uVar7 = 0x1e;
          }
          puVar2 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar7 << 4));
          local_68._0_8_ = *puVar2;
          uVar5 = puVar2[1];
          local_68.w = (float)((ulong)uVar5 >> 0x20);
          local_68.z = (float)uVar5;
          local_68.w = (GImGui->Style).Alpha * local_68.w;
          col = ColorConvertFloat4ToU32(&local_68);
          local_48.x = (float)(int)local_58;
          local_68.y = local_74;
          local_68.x = local_48.x;
          local_48.y = local_80._0_4_;
          ImDrawList::AddLine(this->DrawList,(ImVec2 *)&local_68,&local_48,col,1.0);
          uVar14 = (ulong)local_70;
          if (local_92 == true) {
            if (pIVar9->ActiveIdIsJustActivated == true) {
              (pIVar9->ActiveIdClickOffset).x = (pIVar9->ActiveIdClickOffset).x + -4.0;
            }
            fVar16 = GetDraggedColumnOffset(iVar12);
            SetColumnOffset(iVar12,fVar16);
          }
        }
        uVar7 = (uint)uVar14;
        iVar12 = iVar12 + 1;
      } while (iVar12 < (this->DC).ColumnsCount);
    }
  }
  iVar12 = columns_count + 0x11223347;
  if (local_90 != (char *)0x0) {
    iVar12 = 0x11223347;
  }
  str = "columns";
  if (local_90 != (char *)0x0) {
    str = local_90;
  }
  PushID(iVar12);
  IVar13 = ImGuiWindow::GetID(this,str,(char *)0x0);
  (this->DC).ColumnsSetId = IVar13;
  PopID();
  (this->DC).ColumnsCurrent = 0;
  (this->DC).ColumnsCount = columns_count;
  (this->DC).ColumnsShowBorders = SUB41(uVar7,0);
  fVar16 = (this->SizeContentsExplicit).x;
  fVar17 = 0.0;
  if ((fVar16 == 0.0) && (!NAN(fVar16))) {
    fVar16 = (this->Size).x;
  }
  fVar3 = (this->DC).IndentX;
  (this->DC).ColumnsMinX = fVar3;
  if ((this->Flags & 8) == 0) {
    fVar17 = (pIVar9->Style).ScrollbarSize;
  }
  (this->DC).ColumnsMaxX = (fVar16 - (this->Scroll).x) - fVar17;
  fVar16 = (this->DC).CursorPos.y;
  (this->DC).ColumnsStartPosY = fVar16;
  (this->DC).ColumnsCellMaxY = fVar16;
  (this->DC).ColumnsCellMinY = fVar16;
  (this->DC).ColumnsOffsetX = 0.0;
  (this->DC).CursorPos.x = (float)(int)(fVar3 + (this->Pos).x + 0.0);
  pIVar9 = GImGui;
  if (columns_count != 1) {
    local_90 = (char *)(ulong)(columns_count + 1U);
    iVar12 = (this->DC).ColumnsData.Capacity;
    if (columns_count < iVar12) goto LAB_0013bc16;
    if (iVar12 == 0) {
      uVar7 = 8;
    }
    else {
      uVar7 = iVar12 / 2 + iVar12;
    }
    uVar14 = (ulong)uVar7;
    if ((int)uVar7 <= (int)(columns_count + 1U)) {
      uVar14 = (ulong)local_90;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar8 = (ImGuiColumnData *)(*(pIVar9->IO).MemAllocFn)(uVar14 * 4);
    pIVar11 = (this->DC).ColumnsData.Data;
    if (pIVar11 == (ImGuiColumnData *)0x0) {
LAB_0013bc00:
      pIVar11 = (ImGuiColumnData *)0x0;
      pIVar9 = GImGui;
    }
    else {
      memcpy(pIVar8,pIVar11,(long)(this->DC).ColumnsData.Size << 2);
      pIVar9 = GImGui;
      pIVar11 = (this->DC).ColumnsData.Data;
      if (pIVar11 == (ImGuiColumnData *)0x0) goto LAB_0013bc00;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar9->IO).MemFreeFn)(pIVar11);
    (this->DC).ColumnsData.Data = pIVar8;
    (this->DC).ColumnsData.Capacity = (int)uVar14;
LAB_0013bc16:
    (this->DC).ColumnsData.Size = (int)local_90;
    pIVar9 = GImGui;
    IVar13 = (this->DC).ColumnsSetId;
    IVar4 = GImGui->ActiveId;
    local_84 = (float)(this->DC).ColumnsCount;
    local_58 = (float)(int)local_84;
    this_00 = (this->DC).StateStorage;
    pIVar11 = (this->DC).ColumnsData.Data;
    uVar14 = 0;
    local_80 = this;
    do {
      iVar12 = (int)uVar14;
      if (IVar4 - IVar13 == iVar12) {
        pIVar9->ActiveIdIsAlive = true;
      }
      fVar16 = ImGuiStorage::GetFloat(this_00,IVar13 + iVar12,(float)iVar12 / local_58);
      pIVar11[uVar14].OffsetNorm = fVar16;
      uVar14 = uVar14 + 1;
    } while (local_90 != (char *)uVar14);
    this_01 = local_80->DrawList;
    ImDrawList::ChannelsSplit(this_01,(int)local_84);
    PushColumnClipRect((int)this_01);
    iVar12 = (GImGui->CurrentWindow->DC).ColumnsCurrent;
    fVar16 = GetColumnOffset(iVar12 + 1);
    local_90 = (char *)CONCAT44(local_90._4_4_,fVar16);
    fVar16 = GetColumnOffset(iVar12);
    PushItemWidth((local_90._0_4_ - fVar16) * 0.65);
    return;
  }
  if (-1 < (this->DC).ColumnsData.Capacity) goto LAB_0013bd1c;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  pIVar8 = (ImGuiColumnData *)(*(pIVar9->IO).MemAllocFn)(0);
  pIVar11 = (this->DC).ColumnsData.Data;
  if (pIVar11 == (ImGuiColumnData *)0x0) {
LAB_0013bd03:
    pIVar11 = (ImGuiColumnData *)0x0;
    pIVar9 = GImGui;
  }
  else {
    memcpy(pIVar8,pIVar11,(long)(this->DC).ColumnsData.Size << 2);
    pIVar9 = GImGui;
    pIVar11 = (this->DC).ColumnsData.Data;
    if (pIVar11 == (ImGuiColumnData *)0x0) goto LAB_0013bd03;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar9->IO).MemFreeFn)(pIVar11);
  (this->DC).ColumnsData.Data = pIVar8;
  (this->DC).ColumnsData.Capacity = 0;
LAB_0013bd1c:
  (this->DC).ColumnsData.Size = 0;
  return;
}

Assistant:

void ImGui::Columns(int columns_count, const char* id, bool border)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(columns_count >= 1);

    if (window->DC.ColumnsCount != 1)
    {
        if (window->DC.ColumnsCurrent != 0)
            ItemSize(ImVec2(0,0));   // Advance to column 0
        PopItemWidth();
        PopClipRect();
        window->DrawList->ChannelsMerge();

        window->DC.ColumnsCellMaxY = ImMax(window->DC.ColumnsCellMaxY, window->DC.CursorPos.y);
        window->DC.CursorPos.y = window->DC.ColumnsCellMaxY;
    }

    // Draw columns borders and handle resize at the time of "closing" a columns set
    if (window->DC.ColumnsCount != columns_count && window->DC.ColumnsCount != 1 && window->DC.ColumnsShowBorders && !window->SkipItems)
    {
        const float y1 = window->DC.ColumnsStartPosY;
        const float y2 = window->DC.CursorPos.y;
        for (int i = 1; i < window->DC.ColumnsCount; i++)
        {
            float x = window->Pos.x + GetColumnOffset(i);
            const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(i);
            const ImRect column_rect(ImVec2(x-4,y1),ImVec2(x+4,y2));
            if (IsClippedEx(column_rect, &column_id, false))
                continue;

            bool hovered, held;
            ButtonBehavior(column_rect, column_id, &hovered, &held);
            if (hovered || held)
                g.MouseCursor = ImGuiMouseCursor_ResizeEW;

            // Draw before resize so our items positioning are in sync with the line being drawn
            const ImU32 col = GetColorU32(held ? ImGuiCol_ColumnActive : hovered ? ImGuiCol_ColumnHovered : ImGuiCol_Column);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, y1+1.0f), ImVec2(xi, y2), col);

            if (held)
            {
                if (g.ActiveIdIsJustActivated)
                    g.ActiveIdClickOffset.x -= 4;   // Store from center of column line (we used a 8 wide rect for columns clicking)
                x = GetDraggedColumnOffset(i);
                SetColumnOffset(i, x);
            }
        }
    }

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (id ? 0 : columns_count));
    window->DC.ColumnsSetId = window->GetID(id ? id : "columns");
    PopID();

    // Set state for first column
    window->DC.ColumnsCurrent = 0;
    window->DC.ColumnsCount = columns_count;
    window->DC.ColumnsShowBorders = border;

    const float content_region_width = (window->SizeContentsExplicit.x != 0.0f) ? window->SizeContentsExplicit.x : window->Size.x;
    window->DC.ColumnsMinX = window->DC.IndentX; // Lock our horizontal range
    window->DC.ColumnsMaxX = content_region_width - window->Scroll.x - ((window->Flags & ImGuiWindowFlags_NoScrollbar) ? 0 : g.Style.ScrollbarSize);// - window->WindowPadding().x;
    window->DC.ColumnsStartPosY = window->DC.CursorPos.y;
    window->DC.ColumnsCellMinY = window->DC.ColumnsCellMaxY = window->DC.CursorPos.y;
    window->DC.ColumnsOffsetX = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX);

    if (window->DC.ColumnsCount != 1)
    {
        // Cache column offsets
        window->DC.ColumnsData.resize(columns_count + 1);
        for (int column_index = 0; column_index < columns_count + 1; column_index++)
        {
            const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(column_index);
            KeepAliveID(column_id);
            const float default_t = column_index / (float)window->DC.ColumnsCount;
            const float t = window->DC.StateStorage->GetFloat(column_id, default_t);      // Cheaply store our floating point value inside the integer (could store a union into the map?)
            window->DC.ColumnsData[column_index].OffsetNorm = t;
        }
        window->DrawList->ChannelsSplit(window->DC.ColumnsCount);
        PushColumnClipRect();
        PushItemWidth(GetColumnWidth() * 0.65f);
    }
    else
    {
        window->DC.ColumnsData.resize(0);
    }
}